

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O2

UChar __thiscall
icu_63::UCharCharacterIterator::setIndex(UCharCharacterIterator *this,int32_t position)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (this->super_CharacterIterator).begin;
  if (position < iVar1) {
    (this->super_CharacterIterator).pos = iVar1;
    iVar2 = (this->super_CharacterIterator).end;
    position = iVar1;
  }
  else {
    iVar2 = (this->super_CharacterIterator).end;
    if (iVar2 < position) {
      (this->super_CharacterIterator).pos = iVar2;
      return L'\xffff';
    }
    (this->super_CharacterIterator).pos = position;
  }
  if (iVar2 <= position) {
    return L'\xffff';
  }
  return this->text[position];
}

Assistant:

UChar
UCharCharacterIterator::setIndex(int32_t position) {
    if(position < begin) {
        pos = begin;
    } else if(position > end) {
        pos = end;
    } else {
        pos = position;
    }
    if(pos < end) {
        return text[pos];
    } else {
        return DONE;
    }
}